

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O3

void __thiscall OpenMD::StatWriter::writeMatrix(StatWriter *this,int i)

{
  long lVar1;
  uint j1;
  long lVar2;
  double (*__return_storage_ptr__) [3];
  Mat3x3d s;
  string local_98;
  double local_78 [9];
  
  __return_storage_ptr__ = (double (*) [3])local_78;
  Stats::getMatrixData((Mat3x3d *)__return_storage_ptr__,this->stats_,i);
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      if ((ulong)ABS((((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                     super_RectMatrix<double,_3U,_3U>).data_[0][lVar2]) < 0x7ff0000000000000) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\t",1);
        std::ostream::_M_insert<double>
                  ((((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                   super_RectMatrix<double,_3U,_3U>).data_[0][lVar2]);
      }
      else {
        Stats::getTitle_abi_cxx11_(&local_98,this->stats_,i);
        snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s",
                 local_98._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        painCave.isFatal = 1;
        simError();
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar1 = lVar1 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void StatWriter::writeMatrix(int i) {
    Mat3x3d s = stats_->getMatrixData(i);

    for (unsigned int i1 = 0; i1 < 3; i1++) {
      for (unsigned int j1 = 0; j1 < 3; j1++) {
        if (std::isinf(s(i1, j1)) || std::isnan(s(i1, j1))) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "StatWriter detected a numerical error writing: %s",
                   stats_->getTitle(i).c_str());
          painCave.isFatal = 1;
          simError();
        } else {
          statfile_ << "\t" << s(i1, j1);
        }
      }
    }
  }